

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<Fad<double>,_10>::TPZManVector
          (TPZManVector<Fad<double>,_10> *this,int64_t size,Fad<double> *copy)

{
  int64_t *piVar1;
  int64_t iVar2;
  long lVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  bool bVar6;
  
  lVar3 = 0;
  TPZVec<Fad<double>_>::TPZVec(&this->super_TPZVec<Fad<double>_>,0);
  (this->super_TPZVec<Fad<double>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_016bec38;
  pFVar5 = this->fExtAlloc;
  pFVar4 = pFVar5;
  do {
    Fad<double>::Fad(pFVar4);
    lVar3 = lVar3 + -0x20;
    pFVar4 = pFVar4 + 1;
  } while (lVar3 != -0x140);
  if (size < 0xb) {
    iVar2 = 0;
  }
  else {
    piVar1 = (int64_t *)operator_new__(-(ulong)((ulong)size >> 0x3b != 0) | size * 0x20 | 8);
    *piVar1 = size;
    pFVar5 = (Fad<double> *)(piVar1 + 1);
    lVar3 = 0;
    pFVar4 = pFVar5;
    do {
      Fad<double>::Fad(pFVar4);
      lVar3 = lVar3 + -0x20;
      pFVar4 = pFVar4 + 1;
      iVar2 = size;
    } while (-lVar3 != size * 0x20);
  }
  (this->super_TPZVec<Fad<double>_>).fStore = pFVar5;
  (this->super_TPZVec<Fad<double>_>).fNElements = size;
  (this->super_TPZVec<Fad<double>_>).fNAlloc = iVar2;
  lVar3 = 0;
  if (size < 1) {
    size = lVar3;
  }
  while (bVar6 = size != 0, size = size + -1, bVar6) {
    Fad<double>::operator=
              ((Fad<double> *)((long)&((this->super_TPZVec<Fad<double>_>).fStore)->val_ + lVar3),
               copy);
    lVar3 = lVar3 + 0x20;
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size, const T& copy) :
TPZVec<T>(0)
//fNExtAlloc( NumExtAlloc ) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy;
    }
}